

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

archive_read_filter * get_filter(archive *_a,int n)

{
  archive_read_filter *last;
  archive_read_filter *f;
  archive_read *a;
  int n_local;
  archive *_a_local;
  archive_read_filter *local_8;
  
  last = (archive_read_filter *)_a[8].compression_name;
  if ((n == -1) && (last != (archive_read_filter *)0x0)) {
    for (f = last->upstream; f != (archive_read_filter *)0x0; f = f->upstream) {
      last = f;
    }
    local_8 = last;
  }
  else {
    f = last;
    n_local = n;
    if (n < 0) {
      local_8 = (archive_read_filter *)0x0;
    }
    else {
      for (; 0 < n_local && f != (archive_read_filter *)0x0; n_local = n_local + -1) {
        f = f->upstream;
      }
      local_8 = f;
    }
  }
  return local_8;
}

Assistant:

static struct archive_read_filter *
get_filter(struct archive *_a, int n)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *f = a->filter;
	/* We use n == -1 for 'the last filter', which is always the
	 * client proxy. */
	if (n == -1 && f != NULL) {
		struct archive_read_filter *last = f;
		f = f->upstream;
		while (f != NULL) {
			last = f;
			f = f->upstream;
		}
		return (last);
	}
	if (n < 0)
		return NULL;
	while (n > 0 && f != NULL) {
		f = f->upstream;
		--n;
	}
	return (f);
}